

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeBuilder::registerLabelNode(CodeBuilder *this,CBLabel *node)

{
  CodeHolder *this_00;
  Error EVar1;
  ulong uVar2;
  uint32_t id;
  uint32_t local_2c;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 != 0) {
    return EVar1;
  }
  this_00 = (this->super_CodeEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    registerLabelNode();
  }
  else {
    EVar1 = CodeHolder::newLabelId(this_00,&local_2c);
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar2 = (ulong)(local_2c - 0x100);
    if ((this->_cbLabels).super_ZoneVectorBase._length <= uVar2) {
      EVar1 = ZoneVectorBase::_resize
                        (&(this->_cbLabels).super_ZoneVectorBase,&this->_cbHeap,8,uVar2 + 1);
      if (EVar1 != 0) {
        return EVar1;
      }
      if (uVar2 < (this->_cbLabels).super_ZoneVectorBase._length) {
        *(CBLabel **)((long)(this->_cbLabels).super_ZoneVectorBase._data + uVar2 * 8) = node;
        node->_id = local_2c;
        return 0;
      }
      goto LAB_00162da9;
    }
  }
  registerLabelNode();
LAB_00162da9:
  registerLabelNode();
}

Assistant:

Error CodeBuilder::registerLabelNode(CBLabel* node) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  // Don't call setLastError() from here, we are noexcept and we are called
  // by `newLabelNode()` and `newFuncNode()`, which are noexcept as well.
  uint32_t id;
  ASMJIT_PROPAGATE(_code->newLabelId(id));
  size_t index = Operand::unpackId(id);

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_cbLabels.getLength() < index + 1);
  ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  _cbLabels[index] = node;
  node->_id = id;
  return kErrorOk;
}